

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMRegressor.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::GLMRegressor::MergePartialFromCodedStream
          (GLMRegressor *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  bool bVar4;
  uint32 uVar5;
  uint uVar6;
  int byte_limit;
  Type *this_00;
  pair<int,_int> pVar7;
  char cVar8;
  ulong uVar9;
  
LAB_003bfa83:
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003bfaa6;
      input->buffer_ = pbVar2 + 1;
      uVar9 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003bfaa6:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar9 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar9 = 0x100000000;
      }
      uVar9 = uVar5 | uVar9;
    }
    uVar5 = (uint32)uVar9;
    if ((uVar9 & 0x100000000) == 0) {
LAB_003bfac7:
      if (uVar5 == 0) {
        return true;
      }
      if ((uVar5 & 7) == 4) {
        return true;
      }
      bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar5);
    }
    else {
      uVar6 = (uint)(uVar9 >> 3) & 0x1fffffff;
      cVar8 = (char)uVar9;
      if (uVar6 == 3) {
        if (cVar8 != '\x18') goto LAB_003bfac7;
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          bVar1 = *pbVar2;
          uVar9 = (ulong)bVar1;
          uVar5 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_003bfbc3;
          input->buffer_ = pbVar2 + 1;
        }
        else {
          uVar5 = 0;
LAB_003bfbc3:
          uVar9 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
          if ((long)uVar9 < 0) {
            return false;
          }
        }
        this->postevaluationtransform_ = (int)uVar9;
        goto LAB_003bfa83;
      }
      if (uVar6 == 2) {
        if (cVar8 == '\x11') {
          bVar4 = google::protobuf::internal::WireFormatLite::
                  ReadRepeatedPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                            (1,0x12,input,&this->offset_);
        }
        else {
          if ((uVar5 & 0xff) != 0x12) goto LAB_003bfac7;
          bVar4 = google::protobuf::internal::WireFormatLite::
                  ReadPackedPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                            (input,&this->offset_);
        }
      }
      else {
        if ((uVar6 != 1) || (cVar8 != '\n')) goto LAB_003bfac7;
        this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Add<google::protobuf::RepeatedPtrField<CoreML::Specification::GLMRegressor_DoubleArray>::TypeHandler>
                            (&(this->weights_).super_RepeatedPtrFieldBase,(Type *)0x0);
        puVar3 = input->buffer_;
        if ((puVar3 < input->buffer_end_) && (byte_limit = (int)(char)*puVar3, -1 < byte_limit)) {
          input->buffer_ = puVar3 + 1;
        }
        else {
          byte_limit = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (byte_limit < 0) {
            return false;
          }
        }
        pVar7 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                          (input,byte_limit);
        if ((long)pVar7 < 0) {
          return false;
        }
        bVar4 = GLMRegressor_DoubleArray::MergePartialFromCodedStream(this_00,input);
        if (!bVar4) {
          return false;
        }
        bVar4 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                          (input,pVar7.first);
      }
    }
    if (bVar4 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool GLMRegressor::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.GLMRegressor)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated .CoreML.Specification.GLMRegressor.DoubleArray weights = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_weights()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated double offset = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, this->mutable_offset())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(17u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 1, 18u, input, this->mutable_offset())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.GLMRegressor.PostEvaluationTransform postEvaluationTransform = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_postevaluationtransform(static_cast< ::CoreML::Specification::GLMRegressor_PostEvaluationTransform >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.GLMRegressor)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.GLMRegressor)
  return false;
#undef DO_
}